

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  NamedPortConnectionSyntax *pNVar1;
  DeepCloneVisitor visitor;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  SyntaxNode *local_28;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_68 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x80) == (SyntaxNode *)0x0) {
    local_28 = (SyntaxNode *)0x0;
  }
  else {
    local_28 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x80),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x88),(BumpAllocator *)__child_stack);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NamedPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertyExprSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_48,&local_58,&local_68,
                      (PropertyExprSyntax **)&local_28,&local_38);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NamedPortConnectionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NamedPortConnectionSyntax>(
        *deepClone(node.attributes, alloc),
        node.dot.deepClone(alloc),
        node.name.deepClone(alloc),
        node.openParen.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}